

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

btScalar __thiscall
btGjkEpaSolver2::SignedDistance
          (btGjkEpaSolver2 *this,btVector3 *position,btScalar margin,btConvexShape *shape0,
          btTransform *wtrs0,sResults *results)

{
  undefined8 uVar1;
  void *pvVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  _ _Var9;
  code *pcVar10;
  ulong uVar11;
  long *plVar12;
  float fVar13;
  float fVar14;
  btScalar bVar15;
  btScalar bVar16;
  undefined8 uVar17;
  float fVar18;
  float fVar19;
  float in_XMM1_Da;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar20;
  float fVar21;
  btVector3 bVar22;
  btSphereShape shape1;
  btTransform wtrs1;
  tShape shape;
  GJK gjk;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  btVector3 local_338;
  btConvexInternalShape local_320;
  btTransform local_2d8;
  tShape local_298;
  GJK local_208;
  
  btConvexInternalShape::btConvexInternalShape(&local_320);
  local_320.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btConvexShape_0021e930;
  local_320.super_btConvexShape.super_btCollisionShape.m_shapeType = 8;
  local_208.m_shape.m_shapes[0] = (btConvexShape *)0x0;
  local_208.m_shape.m_shapes[1] = (btConvexShape *)0x3f80000000000000;
  local_320.m_implicitShapeDimensions.m_floats[0] = margin;
  local_320.m_collisionMargin = margin;
  btMatrix3x3::setRotation(&local_2d8.m_basis,(btQuaternion *)&local_208);
  local_2d8.m_origin.m_floats._0_8_ = *(undefined8 *)this;
  local_2d8.m_origin.m_floats._8_8_ = *(undefined8 *)(this + 8);
  gjkepa2_impl::Initialize
            ((btConvexShape *)position,(btTransform *)shape0,&local_320.super_btConvexShape,
             &local_2d8,(sResults *)wtrs0,&local_298,false);
  local_208.m_nfree = 0;
  local_208.m_current = 0;
  local_208.m_ray.m_floats[0] = 0.0;
  local_208.m_ray.m_floats[1] = 0.0;
  local_208.m_ray.m_floats[2] = 0.0;
  local_208.m_ray.m_floats[3] = 0.0;
  local_208.m_status = Failed;
  local_208.m_distance = 0.0;
  local_338.m_floats[2] = 1.0;
  local_338.m_floats[3] = 0.0;
  local_338.m_floats[0] = 1.0;
  local_338.m_floats[1] = 1.0;
  _Var9 = gjkepa2_impl::GJK::Evaluate(&local_208,&local_298,&local_338);
  bVar15 = 3.4028235e+38;
  if (_Var9 == Inside) {
    bVar8 = Penetration((btConvexShape *)position,(btTransform *)shape0,
                        &local_320.super_btConvexShape,&local_2d8,&local_208.m_ray,(sResults *)wtrs0
                        ,true);
    if (bVar8) {
      uVar17 = *(undefined8 *)((wtrs0->m_basis).m_el[0].m_floats + 1);
      uVar1 = *(undefined8 *)((wtrs0->m_basis).m_el[1].m_floats + 1);
      fVar13 = (float)uVar17 - (float)uVar1;
      fVar14 = (float)((ulong)uVar17 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
      fVar18 = (wtrs0->m_basis).m_el[0].m_floats[3] - (wtrs0->m_basis).m_el[1].m_floats[3];
      fVar19 = SQRT(fVar18 * fVar18 + fVar13 * fVar13 + fVar14 * fVar14);
      if (1.1920929e-07 <= fVar19) {
        fVar21 = 1.0 / fVar19;
        auVar7._4_4_ = fVar14 * fVar21;
        auVar7._0_4_ = fVar13 * fVar21;
        auVar7._8_4_ = fVar18 * fVar21;
        auVar7._12_4_ = 0;
        *(undefined1 (*) [16])((wtrs0->m_basis).m_el[2].m_floats + 1) = auVar7;
      }
      bVar15 = -fVar19;
    }
  }
  else if (_Var9 == Valid) {
    if ((local_208.m_simplex)->rank == 0) {
      local_378._4_4_ = 0.0;
      local_378._0_4_ = 0.0;
      in_XMM1_Da = 0.0;
      local_388._4_4_ = 0.0;
      in_XMM1_Dc = 0.0;
      in_XMM1_Dd = 0.0;
    }
    else {
      _local_388 = ZEXT816(0);
      uVar11 = 0;
      _local_378 = ZEXT816(0);
      do {
        plVar12 = (long *)((long)&(local_298.m_shapes[0]->super_btCollisionShape).
                                  _vptr_btCollisionShape + local_298._136_8_);
        pcVar10 = (code *)local_298.Ls;
        if ((local_298.Ls & 1) != 0) {
          pcVar10 = *(code **)(local_298.Ls + *plVar12 + -1);
        }
        fVar13 = (local_208.m_simplex)->p[uVar11];
        uVar17 = (*pcVar10)(plVar12,(local_208.m_simplex)->c[uVar11]);
        uVar3 = *(ulong *)((local_208.m_simplex)->c[uVar11]->d).m_floats ^ 0x8000000080000000;
        local_338.m_floats[2] = -((local_208.m_simplex)->c[uVar11]->d).m_floats[2];
        local_338.m_floats[0] = (btScalar)(int)uVar3;
        local_338.m_floats[1] = (btScalar)(int)(uVar3 >> 0x20);
        local_338.m_floats[3] = 0.0;
        bVar22 = gjkepa2_impl::MinkowskiDiff::Support(&local_298,&local_338,1);
        local_378._0_4_ = (float)local_378._0_4_ + in_XMM1_Da * fVar13;
        local_378._4_4_ = (float)local_378._4_4_ + (float)((ulong)uVar17 >> 0x20) * fVar13;
        fStack_370 = fStack_370 + in_XMM1_Dc * fVar13;
        fStack_36c = fStack_36c + in_XMM1_Dd * fVar13;
        in_XMM1_Da = (float)local_388._0_4_ + bVar22.m_floats[0] * fVar13;
        local_388._4_4_ = (float)local_388._4_4_ + bVar22.m_floats[1] * fVar13;
        in_XMM1_Dc = fStack_380 + bVar22.m_floats[2] * fVar13;
        in_XMM1_Dd = fStack_37c + (float)uVar17 * fVar13;
        local_388._0_4_ = in_XMM1_Da;
        fStack_380 = in_XMM1_Dc;
        fStack_37c = in_XMM1_Dd;
        uVar11 = uVar11 + 1;
      } while (uVar11 < (local_208.m_simplex)->rank);
    }
    fVar20 = (float)shape0[1].super_btCollisionShape.m_shapeType * (float)local_378._0_4_ +
             *(float *)&shape0[1].super_btCollisionShape._vptr_btCollisionShape * in_XMM1_Dd +
             *(float *)((long)&shape0[1].super_btCollisionShape._vptr_btCollisionShape + 4) *
             (float)local_378._4_4_ + (float)shape0[1].super_btCollisionShape.m_userIndex;
    pvVar2 = shape0[1].super_btCollisionShape.m_userPointer;
    fVar13 = SUB84(pvVar2,0) +
             (float)(shape0->super_btCollisionShape).m_shapeType * (float)local_378._0_4_ +
             *(float *)&(shape0->super_btCollisionShape)._vptr_btCollisionShape * in_XMM1_Dd +
             *(float *)((long)&(shape0->super_btCollisionShape)._vptr_btCollisionShape + 4) *
             (float)local_378._4_4_;
    fVar18 = (float)((ulong)pvVar2 >> 0x20) +
             (float)(shape0->super_btCollisionShape).m_userIndex * (float)local_378._0_4_ +
             *(float *)&(shape0->super_btCollisionShape).m_userPointer * in_XMM1_Dd +
             *(float *)((long)&(shape0->super_btCollisionShape).m_userPointer + 4) *
             (float)local_378._4_4_;
    auVar4._4_4_ = fVar18;
    auVar4._0_4_ = fVar13;
    auVar4._8_4_ = fVar20;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])((wtrs0->m_basis).m_el[0].m_floats + 1) = auVar4;
    pvVar2 = shape0[1].super_btCollisionShape.m_userPointer;
    fVar14 = SUB84(pvVar2,0) +
             (float)(shape0->super_btCollisionShape).m_shapeType * in_XMM1_Dc +
             *(float *)&(shape0->super_btCollisionShape)._vptr_btCollisionShape * in_XMM1_Da +
             *(float *)((long)&(shape0->super_btCollisionShape)._vptr_btCollisionShape + 4) *
             (float)local_388._4_4_;
    fVar19 = (float)((ulong)pvVar2 >> 0x20) +
             (float)(shape0->super_btCollisionShape).m_userIndex * in_XMM1_Dc +
             *(float *)&(shape0->super_btCollisionShape).m_userPointer * in_XMM1_Da +
             *(float *)((long)&(shape0->super_btCollisionShape).m_userPointer + 4) *
             (float)local_388._4_4_;
    fVar21 = in_XMM1_Dc * (float)shape0[1].super_btCollisionShape.m_shapeType +
             *(float *)&shape0[1].super_btCollisionShape._vptr_btCollisionShape * in_XMM1_Da +
             (float)local_388._4_4_ *
             *(float *)((long)&shape0[1].super_btCollisionShape._vptr_btCollisionShape + 4) +
             (float)shape0[1].super_btCollisionShape.m_userIndex;
    auVar5._4_4_ = fVar19;
    auVar5._0_4_ = fVar14;
    auVar5._8_4_ = fVar21;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])((wtrs0->m_basis).m_el[1].m_floats + 1) = auVar5;
    bVar15 = btConvexShape::getMarginNonVirtual((btConvexShape *)position);
    bVar16 = btConvexShape::getMarginNonVirtual(&local_320.super_btConvexShape);
    fVar14 = fVar14 - fVar13;
    fVar19 = fVar19 - fVar18;
    fVar21 = fVar21 - fVar20;
    fVar20 = bVar15 + bVar16;
    fVar18 = SQRT(fVar21 * fVar21 + fVar14 * fVar14 + fVar19 * fVar19);
    fVar13 = 1.0 / fVar18;
    bVar15 = fVar18 - fVar20;
    auVar6._4_4_ = fVar13 * fVar19;
    auVar6._0_4_ = fVar13 * fVar14;
    auVar6._8_4_ = fVar21 * fVar13;
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])((wtrs0->m_basis).m_el[2].m_floats + 1) = auVar6;
    uVar17 = *(undefined8 *)((wtrs0->m_basis).m_el[0].m_floats + 1);
    *(ulong *)((wtrs0->m_basis).m_el[0].m_floats + 1) =
         CONCAT44((float)((ulong)uVar17 >> 0x20) + fVar20 * fVar13 * fVar19,
                  (float)uVar17 + fVar20 * fVar13 * fVar14);
    (wtrs0->m_basis).m_el[0].m_floats[3] =
         fVar21 * fVar13 * fVar20 + (wtrs0->m_basis).m_el[0].m_floats[3];
  }
  btConvexShape::~btConvexShape(&local_320.super_btConvexShape);
  return bVar15;
}

Assistant:

btScalar	btGjkEpaSolver2::SignedDistance(const btVector3& position,
											btScalar margin,
											const btConvexShape* shape0,
											const btTransform& wtrs0,
											sResults& results)
{
	tShape			shape;
	btSphereShape	shape1(margin);
	btTransform		wtrs1(btQuaternion(0,0,0,1),position);
	Initialize(shape0,wtrs0,&shape1,wtrs1,results,shape,false);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,btVector3(1,1,1));
	if(gjk_status==GJK::eStatus::Valid)
	{
		btVector3	w0=btVector3(0,0,0);
		btVector3	w1=btVector3(0,0,0);
		for(U i=0;i<gjk.m_simplex->rank;++i)
		{
			const btScalar	p=gjk.m_simplex->p[i];
			w0+=shape.Support( gjk.m_simplex->c[i]->d,0)*p;
			w1+=shape.Support(-gjk.m_simplex->c[i]->d,1)*p;
		}
		results.witnesses[0]	=	wtrs0*w0;
		results.witnesses[1]	=	wtrs0*w1;
		const btVector3	delta=	results.witnesses[1]-
			results.witnesses[0];
		const btScalar	margin=	shape0->getMarginNonVirtual()+
			shape1.getMarginNonVirtual();
		const btScalar	length=	delta.length();	
		results.normal			=	delta/length;
		results.witnesses[0]	+=	results.normal*margin;
		return(length-margin);
	}
	else
	{
		if(gjk_status==GJK::eStatus::Inside)
		{
			if(Penetration(shape0,wtrs0,&shape1,wtrs1,gjk.m_ray,results))
			{
				const btVector3	delta=	results.witnesses[0]-
					results.witnesses[1];
				const btScalar	length=	delta.length();
				if (length >= SIMD_EPSILON)
					results.normal	=	delta/length;			
				return(-length);
			}
		}	
	}
	return(SIMD_INFINITY);
}